

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_2cd882::TfFinder::~TfFinder(TfFinder *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_TokenFilter)._vptr_TokenFilter = (_func_int **)&PTR__TfFinder_002ef758;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->DA);
  pcVar1 = (this->last_name)._M_dataplus._M_p;
  paVar2 = &(this->last_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->font_name)._M_dataplus._M_p;
  paVar2 = &(this->font_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~TfFinder() override = default;